

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::echo(TestMoreStuffImpl *this,EchoContext context)

{
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Builder result;
  Reader params;
  undefined1 local_b0 [24];
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  local_98;
  Maybe<capnp::MessageSize> local_90;
  Builder local_78;
  Reader local_50;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::getParams(&local_50,&local_98);
  local_90.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  ::getResults(&local_78,&local_98,&local_90);
  capnproto_test::capnp::test::TestMoreStuff::EchoParams::Reader::getCap
            ((Client *)local_b0,&local_50);
  capnproto_test::capnp::test::TestMoreStuff::EchoResults::Builder::setCap
            (&local_78,(Client *)local_b0);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_b0 + 8));
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::echo(EchoContext context) {
  ++callCount;
  auto params = context.getParams();
  auto result = context.getResults();
  result.setCap(params.getCap());
  return kj::READY_NOW;
}